

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *other_local;
  InternalMetadata *this_local;
  
  pbVar1 = mutable_unknown_fields<std::__cxx11::string>(this);
  std::__cxx11::string::swap((string *)pbVar1);
  return;
}

Assistant:

void InternalMetadata::DoSwap<std::string>(std::string* other) {
  mutable_unknown_fields<std::string>()->swap(*other);
}